

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadTokens(CrateReader *this)

{
  long lVar1;
  unsigned_long uVar2;
  StreamReader *this_00;
  undefined8 uVar3;
  void *pvVar4;
  ulong uVar5;
  bool bVar6;
  size_type sVar7;
  ostream *poVar8;
  reference pvVar9;
  void *pvVar10;
  unsigned_long *puVar11;
  char *pcVar12;
  char *outputPtr;
  size_t sVar13;
  string *err;
  uchar *in_R9;
  string local_2070;
  undefined1 local_2050 [16];
  string local_2040 [32];
  string local_2020;
  ostringstream local_2000 [8];
  ostringstream ss_e_18;
  undefined1 local_1e88 [8];
  token tok;
  allocator local_1e41;
  string local_1e40 [32];
  undefined1 local_1e20 [8];
  string str;
  size_t len;
  size_t i;
  size_t sStack_1de8;
  anon_class_1_0_00000001 my_strnlen;
  size_t nbytes_remain;
  char *pcurr;
  char *pe;
  char *ps;
  ostringstream local_1da8 [8];
  ostringstream ss_e_17;
  int local_1c2c;
  string local_1c28;
  ostringstream local_1c08 [8];
  ostringstream ss_e_16;
  allocator_type local_1a89;
  undefined1 local_1a88 [8];
  vector<char,_std::allocator<char>_> compressed;
  undefined1 local_1a68 [8];
  vector<char,_std::allocator<char>_> chars;
  ostringstream local_1a30 [8];
  ostringstream ss_e_15;
  string local_18b8;
  ostringstream local_1898 [8];
  ostringstream ss_e_14;
  uint64_t bufSize;
  ostringstream local_16f8 [8];
  ostringstream ss_e_13;
  string local_1580;
  ostringstream local_1560 [8];
  ostringstream ss_e_12;
  string local_13e8;
  ostringstream local_13c8 [8];
  ostringstream ss_e_11;
  string local_1250;
  ostringstream local_1230 [8];
  ostringstream ss_e_10;
  void *local_10b8;
  uint64_t compressedSize;
  ostringstream local_1090 [8];
  ostringstream ss_e_9;
  string local_f18;
  ostringstream local_ef8 [8];
  ostringstream ss_e_8;
  string local_d80;
  ostringstream local_d60 [8];
  ostringstream ss_e_7;
  ulong local_be8;
  uint64_t uncompressedSize;
  ostringstream local_bc0 [8];
  ostringstream ss_e_6;
  string local_a48;
  ostringstream local_a28 [8];
  ostringstream ss_e_5;
  string local_8b0;
  ostringstream local_890 [8];
  ostringstream ss_e_4;
  ulong local_718;
  uint64_t num_tokens;
  allocator local_6e9;
  string local_6e8;
  string local_6c8;
  ostringstream local_6a8 [8];
  ostringstream ss_e_3;
  string local_530;
  ostringstream local_510 [8];
  ostringstream ss_e_2;
  Section *sec;
  allocator local_369;
  string local_368 [32];
  string local_348;
  ostringstream local_328 [8];
  ostringstream ss_e_1;
  string local_1b0;
  ostringstream local_190 [8];
  ostringstream ss_e;
  CrateReader *this_local;
  
  if ((this->_tokens_index < 0) ||
     (lVar1 = this->_tokens_index,
     sVar7 = ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
             size(&(this->_toc).sections), (long)sVar7 <= lVar1)) {
    ::std::__cxx11::ostringstream::ostringstream(local_190);
    poVar8 = ::std::operator<<((ostream *)local_190,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,"[Crate]");
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReadTokens");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1549);
    ::std::operator<<(poVar8," ");
    poVar8 = ::std::operator<<((ostream *)local_190,"Invalid index for `TOKENS` section.");
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1b0);
    ::std::__cxx11::string::~string((string *)&local_1b0);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else if ((this->_version[0] == '\0') && (this->_version[1] < 4)) {
    ::std::__cxx11::ostringstream::ostringstream(local_328);
    poVar8 = ::std::operator<<((ostream *)local_328,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,"[Crate]");
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReadTokens");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x154e);
    ::std::operator<<(poVar8," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_368,"Version must be 0.4.0 or later, but got {}.{}.{}",&local_369);
    fmt::format<unsigned_char,unsigned_char,unsigned_char>
              (&local_348,(fmt *)local_368,(string *)this,this->_version + 1,this->_version + 2,
               in_R9);
    poVar8 = ::std::operator<<((ostream *)local_328,(string *)&local_348);
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::string::~string((string *)&local_348);
    ::std::__cxx11::string::~string(local_368);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_369);
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&sec);
    ::std::__cxx11::string::~string((string *)&sec);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_328);
  }
  else {
    pvVar9 = ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
             operator[](&(this->_toc).sections,this->_tokens_index);
    bVar6 = StreamReader::seek_set(this->_sr,pvVar9->start);
    if (bVar6) {
      if (pvVar9->size < 4) {
        ::std::__cxx11::ostringstream::ostringstream(local_6a8);
        poVar8 = ::std::operator<<((ostream *)local_6a8,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,"[Crate]");
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReadTokens");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1558);
        ::std::operator<<(poVar8," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_6e8,"`TOKENS` section data size is zero or too small.",
                   &local_6e9);
        fmt::format(&local_6c8,&local_6e8);
        poVar8 = ::std::operator<<((ostream *)local_6a8,(string *)&local_6c8);
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::string::~string((string *)&local_6c8);
        ::std::__cxx11::string::~string((string *)&local_6e8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&num_tokens);
        ::std::__cxx11::string::~string((string *)&num_tokens);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_6a8);
      }
      else {
        bVar6 = StreamReader::read8(this->_sr,&local_718);
        if (bVar6) {
          if (local_718 == 0) {
            ::std::__cxx11::ostringstream::ostringstream(local_a28);
            poVar8 = ::std::operator<<((ostream *)local_a28,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,"[Crate]");
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReadTokens");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1567);
            ::std::operator<<(poVar8," ");
            poVar8 = ::std::operator<<((ostream *)local_a28,"Empty tokens.");
            ::std::operator<<(poVar8,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_a48);
            ::std::__cxx11::string::~string((string *)&local_a48);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_a28);
          }
          else if ((this->_config).maxNumTokens < local_718) {
            ::std::__cxx11::ostringstream::ostringstream(local_bc0);
            poVar8 = ::std::operator<<((ostream *)local_bc0,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,"[Crate]");
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReadTokens");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x156b);
            ::std::operator<<(poVar8," ");
            poVar8 = ::std::operator<<((ostream *)local_bc0,"Too many Tokens.");
            ::std::operator<<(poVar8,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&uncompressedSize);
            ::std::__cxx11::string::~string((string *)&uncompressedSize);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_bc0);
          }
          else {
            bVar6 = StreamReader::read8(this->_sr,&local_be8);
            if (bVar6) {
              if (local_be8 < local_718 + 3) {
                ::std::__cxx11::ostringstream::ostringstream(local_ef8);
                poVar8 = ::std::operator<<((ostream *)local_ef8,"[error]");
                poVar8 = ::std::operator<<(poVar8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar8 = ::std::operator<<(poVar8,"[Crate]");
                poVar8 = ::std::operator<<(poVar8,":");
                poVar8 = ::std::operator<<(poVar8,"ReadTokens");
                poVar8 = ::std::operator<<(poVar8,"():");
                poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x157d);
                ::std::operator<<(poVar8," ");
                poVar8 = ::std::operator<<((ostream *)local_ef8,"`TOKENS` section corrupted.");
                ::std::operator<<(poVar8,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_f18);
                ::std::__cxx11::string::~string((string *)&local_f18);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_ef8);
              }
              else if (local_be8 < 4) {
                ::std::__cxx11::ostringstream::ostringstream(local_1090);
                poVar8 = ::std::operator<<((ostream *)local_1090,"[error]");
                poVar8 = ::std::operator<<(poVar8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar8 = ::std::operator<<(poVar8,"[Crate]");
                poVar8 = ::std::operator<<(poVar8,":");
                poVar8 = ::std::operator<<(poVar8,"ReadTokens");
                poVar8 = ::std::operator<<(poVar8,"():");
                poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1582);
                ::std::operator<<(poVar8," ");
                poVar8 = ::std::operator<<((ostream *)local_1090,
                                           "uncompressedSize too small or zero bytes.");
                ::std::operator<<(poVar8,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&compressedSize);
                ::std::__cxx11::string::~string((string *)&compressedSize);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_1090);
              }
              else {
                bVar6 = StreamReader::read8(this->_sr,(uint64_t *)&local_10b8);
                pvVar4 = local_10b8;
                if (bVar6) {
                  if (local_10b8 < (void *)0x4) {
                    ::std::__cxx11::ostringstream::ostringstream(local_13c8);
                    poVar8 = ::std::operator<<((ostream *)local_13c8,"[error]");
                    poVar8 = ::std::operator<<(poVar8,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                              );
                    poVar8 = ::std::operator<<(poVar8,"[Crate]");
                    poVar8 = ::std::operator<<(poVar8,":");
                    poVar8 = ::std::operator<<(poVar8,"ReadTokens");
                    poVar8 = ::std::operator<<(poVar8,"():");
                    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x158d);
                    ::std::operator<<(poVar8," ");
                    poVar8 = ::std::operator<<((ostream *)local_13c8,
                                               "compressedSize is too small or zero bytes.");
                    ::std::operator<<(poVar8,"\n");
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,&local_13e8);
                    ::std::__cxx11::string::~string((string *)&local_13e8);
                    this_local._7_1_ = 0;
                    ::std::__cxx11::ostringstream::~ostringstream(local_13c8);
                  }
                  else {
                    pvVar10 = (void *)StreamReader::size(this->_sr);
                    if (pvVar10 < pvVar4) {
                      ::std::__cxx11::ostringstream::ostringstream(local_1560);
                      poVar8 = ::std::operator<<((ostream *)local_1560,"[error]");
                      poVar8 = ::std::operator<<(poVar8,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                );
                      poVar8 = ::std::operator<<(poVar8,"[Crate]");
                      poVar8 = ::std::operator<<(poVar8,":");
                      poVar8 = ::std::operator<<(poVar8,"ReadTokens");
                      poVar8 = ::std::operator<<(poVar8,"():");
                      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1591);
                      ::std::operator<<(poVar8," ");
                      poVar8 = ::std::operator<<((ostream *)local_1560,
                                                 "Compressed data size exceeds input file size.");
                      ::std::operator<<(poVar8,"\n");
                      ::std::__cxx11::ostringstream::str();
                      PushError(this,&local_1580);
                      ::std::__cxx11::string::~string((string *)&local_1580);
                      this_local._7_1_ = 0;
                      ::std::__cxx11::ostringstream::~ostringstream(local_1560);
                    }
                    else if ((void *)pvVar9->size < local_10b8) {
                      ::std::__cxx11::ostringstream::ostringstream(local_16f8);
                      poVar8 = ::std::operator<<((ostream *)local_16f8,"[error]");
                      poVar8 = ::std::operator<<(poVar8,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                );
                      poVar8 = ::std::operator<<(poVar8,"[Crate]");
                      poVar8 = ::std::operator<<(poVar8,":");
                      poVar8 = ::std::operator<<(poVar8,"ReadTokens");
                      poVar8 = ::std::operator<<(poVar8,"():");
                      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1595);
                      ::std::operator<<(poVar8," ");
                      poVar8 = ::std::operator<<((ostream *)local_16f8,
                                                 "Compressed data size exceeds `TOKENS` section size."
                                                );
                      ::std::operator<<(poVar8,"\n");
                      ::std::__cxx11::ostringstream::str();
                      PushError(this,(string *)&bufSize);
                      ::std::__cxx11::string::~string((string *)&bufSize);
                      this_local._7_1_ = 0;
                      ::std::__cxx11::ostringstream::~ostringstream(local_16f8);
                    }
                    else {
                      puVar11 = std::max<unsigned_long>((unsigned_long *)&local_10b8,&local_be8);
                      uVar5 = local_be8;
                      uVar2 = *puVar11;
                      this->_memoryUsage = uVar2 + 0x80 + this->_memoryUsage;
                      if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                        ::std::__cxx11::ostringstream::ostringstream(local_1898);
                        poVar8 = ::std::operator<<((ostream *)local_1898,"[error]");
                        poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                        poVar8 = ::std::operator<<(poVar8,"[Crate]");
                        poVar8 = ::std::operator<<(poVar8,":");
                        poVar8 = ::std::operator<<(poVar8,"ReadTokens");
                        poVar8 = ::std::operator<<(poVar8,"():");
                        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x159d);
                        ::std::operator<<(poVar8," ");
                        poVar8 = ::std::operator<<((ostream *)local_1898,
                                                   "Reached to max memory budget.");
                        ::std::operator<<(poVar8,"\n");
                        ::std::__cxx11::ostringstream::str();
                        PushError(this,&local_18b8);
                        ::std::__cxx11::string::~string((string *)&local_18b8);
                        this_local._7_1_ = 0;
                        ::std::__cxx11::ostringstream::~ostringstream(local_1898);
                      }
                      else {
                        this->_memoryUsage = local_be8 + this->_memoryUsage;
                        if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                          ::std::__cxx11::ostringstream::ostringstream(local_1a30);
                          poVar8 = ::std::operator<<((ostream *)local_1a30,"[error]");
                          poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                          poVar8 = ::std::operator<<(poVar8,"[Crate]");
                          poVar8 = ::std::operator<<(poVar8,":");
                          poVar8 = ::std::operator<<(poVar8,"ReadTokens");
                          poVar8 = ::std::operator<<(poVar8,"():");
                          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x159e);
                          ::std::operator<<(poVar8," ");
                          poVar8 = ::std::operator<<((ostream *)local_1a30,
                                                     "Reached to max memory budget.");
                          ::std::operator<<(poVar8,"\n");
                          ::std::__cxx11::ostringstream::str();
                          PushError(this,(string *)
                                         &chars.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.field_0x10);
                          ::std::__cxx11::string::~string
                                    ((string *)
                                     &chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      field_0x10);
                          this_local._7_1_ = 0;
                          ::std::__cxx11::ostringstream::~ostringstream(local_1a30);
                        }
                        else {
                          ::std::allocator<char>::allocator();
                          std::vector<char,_std::allocator<char>_>::vector
                                    ((vector<char,_std::allocator<char>_> *)local_1a68,uVar5,
                                     (allocator_type *)
                                     &compressed.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.field_0x17);
                          ::std::allocator<char>::~allocator
                                    ((allocator<char> *)
                                     &compressed.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.field_0x17);
                          pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                              ((vector<char,_std::allocator<char>_> *)local_1a68);
                          sVar7 = ::std::vector<char,_std::allocator<char>_>::size
                                            ((vector<char,_std::allocator<char>_> *)local_1a68);
                          memset(pcVar12,0,sVar7);
                          ::std::allocator<char>::allocator();
                          std::vector<char,_std::allocator<char>_>::vector
                                    ((vector<char,_std::allocator<char>_> *)local_1a88,uVar2 + 0x80,
                                     &local_1a89);
                          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a89);
                          pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                              ((vector<char,_std::allocator<char>_> *)local_1a88);
                          sVar7 = ::std::vector<char,_std::allocator<char>_>::size
                                            ((vector<char,_std::allocator<char>_> *)local_1a88);
                          memset(pcVar12,0,sVar7);
                          pvVar4 = local_10b8;
                          this_00 = this->_sr;
                          pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                              ((vector<char,_std::allocator<char>_> *)local_1a88);
                          pvVar10 = (void *)StreamReader::read(this_00,(int)pvVar4,pvVar4,
                                                               (size_t)pcVar12);
                          uVar5 = local_be8;
                          if (pvVar4 == pvVar10) {
                            pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                                ((vector<char,_std::allocator<char>_> *)local_1a88);
                            outputPtr = std::vector<char,_std::allocator<char>_>::data
                                                  ((vector<char,_std::allocator<char>_> *)local_1a68
                                                  );
                            err = &this->_err;
                            sVar13 = LZ4Compression::DecompressFromBuffer
                                               (pcVar12,outputPtr,(size_t)local_10b8,local_be8,err);
                            if (uVar5 == sVar13) {
                              nbytes_remain =
                                   (size_t)std::vector<char,_std::allocator<char>_>::data
                                                     ((vector<char,_std::allocator<char>_> *)
                                                      local_1a68);
                              pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                                  ((vector<char,_std::allocator<char>_> *)local_1a68
                                                  );
                              sVar7 = ::std::vector<char,_std::allocator<char>_>::size
                                                ((vector<char,_std::allocator<char>_> *)local_1a68);
                              pcVar12 = pcVar12 + sVar7;
                              sStack_1de8 = ::std::vector<char,_std::allocator<char>_>::size
                                                      ((vector<char,_std::allocator<char>_> *)
                                                       local_1a68);
                              for (len = 0; len < local_718; len = len + 1) {
                                str.field_2._8_8_ =
                                     ReadTokens::anon_class_1_0_00000001::operator()
                                               ((anon_class_1_0_00000001 *)((long)&i + 7),
                                                (char *)nbytes_remain,sStack_1de8);
                                if (pcVar12 < (char *)(nbytes_remain + str.field_2._8_8_ + 1)) {
                                  ::std::__cxx11::string::operator+=
                                            ((string *)&this->_err,"Invalid token string array.\n");
                                  this_local._7_1_ = 0;
                                  goto LAB_0024959e;
                                }
                                ::std::__cxx11::string::string((string *)local_1e20);
                                uVar3 = str.field_2._8_8_;
                                if (str.field_2._8_8_ == 0) {
                                  ::std::__cxx11::string::string
                                            ((string *)(tok.str_.field_2._M_local_buf + 8));
                                  ::std::__cxx11::string::operator=
                                            ((string *)local_1e20,
                                             (string *)(tok.str_.field_2._M_local_buf + 8));
                                  ::std::__cxx11::string::~string
                                            ((string *)(tok.str_.field_2._M_local_buf + 8));
                                }
                                else {
                                  ::std::allocator<char>::allocator();
                                  ::std::__cxx11::string::string
                                            (local_1e40,(char *)nbytes_remain,uVar3,&local_1e41);
                                  ::std::__cxx11::string::operator=((string *)local_1e20,local_1e40)
                                  ;
                                  ::std::__cxx11::string::~string(local_1e40);
                                  ::std::allocator<char>::~allocator((allocator<char> *)&local_1e41)
                                  ;
                                }
                                nbytes_remain = str.field_2._8_8_ + 1 + nbytes_remain;
                                sStack_1de8 = (long)pcVar12 - nbytes_remain;
                                if (pcVar12 < nbytes_remain) {
                                  ::std::__cxx11::string::operator+=
                                            ((string *)&this->_err,"Invalid token string array.\n");
                                  this_local._7_1_ = 0;
                                  local_1c2c = 1;
                                }
                                else {
                                  Token::Token((Token *)local_1e88,(string *)local_1e20);
                                  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                  push_back(&this->_tokens,(value_type *)local_1e88);
                                  if (sStack_1de8 == 0) {
                                    local_1c2c = 0x2a;
                                  }
                                  else {
                                    local_1c2c = 0;
                                  }
                                  Token::~Token((Token *)local_1e88);
                                }
                                ::std::__cxx11::string::~string((string *)local_1e20);
                                if (local_1c2c != 0) {
                                  if (local_1c2c != 0x2a) goto LAB_0024959e;
                                  break;
                                }
                              }
                              sVar7 = ::std::
                                      vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                      size(&this->_tokens);
                              if (sVar7 == local_718) {
                                this_local._7_1_ = 1;
                              }
                              else {
                                ::std::__cxx11::ostringstream::ostringstream(local_2000);
                                poVar8 = ::std::operator<<((ostream *)local_2000,"[error]");
                                poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                poVar8 = ::std::operator<<(poVar8,"[Crate]");
                                poVar8 = ::std::operator<<(poVar8,":");
                                poVar8 = ::std::operator<<(poVar8,"ReadTokens");
                                poVar8 = ::std::operator<<(poVar8,"():");
                                poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x15f2);
                                ::std::operator<<(poVar8," ");
                                ::std::allocator<char>::allocator();
                                ::std::__cxx11::string::string
                                          (local_2040,
                                           "The number of tokens parsed {} does not match the requested one {}"
                                           ,(allocator *)(local_2050 + 0xf));
                                local_2050._0_8_ =
                                     ::std::
                                     vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                               (&this->_tokens);
                                fmt::format<unsigned_long,unsigned_long>
                                          (&local_2020,(fmt *)local_2040,(string *)local_2050,
                                           &local_718,(unsigned_long *)err);
                                poVar8 = ::std::operator<<((ostream *)local_2000,
                                                           (string *)&local_2020);
                                ::std::operator<<(poVar8,"\n");
                                ::std::__cxx11::string::~string((string *)&local_2020);
                                ::std::__cxx11::string::~string(local_2040);
                                ::std::allocator<char>::~allocator
                                          ((allocator<char> *)(local_2050 + 0xf));
                                ::std::__cxx11::ostringstream::str();
                                PushError(this,&local_2070);
                                ::std::__cxx11::string::~string((string *)&local_2070);
                                this_local._7_1_ = 0;
                                ::std::__cxx11::ostringstream::~ostringstream(local_2000);
                              }
                            }
                            else {
                              ::std::__cxx11::ostringstream::ostringstream(local_1da8);
                              poVar8 = ::std::operator<<((ostream *)local_1da8,"[error]");
                              poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                              poVar8 = ::std::operator<<(poVar8,"[Crate]");
                              poVar8 = ::std::operator<<(poVar8,":");
                              poVar8 = ::std::operator<<(poVar8,"ReadTokens");
                              poVar8 = ::std::operator<<(poVar8,"():");
                              poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x15b3);
                              ::std::operator<<(poVar8," ");
                              poVar8 = ::std::operator<<((ostream *)local_1da8,
                                                         "Failed to decompress data of Tokens.");
                              ::std::operator<<(poVar8,"\n");
                              ::std::__cxx11::ostringstream::str();
                              PushError(this,(string *)&ps);
                              ::std::__cxx11::string::~string((string *)&ps);
                              this_local._7_1_ = 0;
                              ::std::__cxx11::ostringstream::~ostringstream(local_1da8);
                            }
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream(local_1c08);
                            poVar8 = ::std::operator<<((ostream *)local_1c08,"[error]");
                            poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                            poVar8 = ::std::operator<<(poVar8,"[Crate]");
                            poVar8 = ::std::operator<<(poVar8,":");
                            poVar8 = ::std::operator<<(poVar8,"ReadTokens");
                            poVar8 = ::std::operator<<(poVar8,"():");
                            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x15ab);
                            ::std::operator<<(poVar8," ");
                            poVar8 = ::std::operator<<((ostream *)local_1c08,
                                                                                                              
                                                  "Failed to read compressed data at `TOKENS` section."
                                                  );
                            ::std::operator<<(poVar8,"\n");
                            ::std::__cxx11::ostringstream::str();
                            PushError(this,&local_1c28);
                            ::std::__cxx11::string::~string((string *)&local_1c28);
                            this_local._7_1_ = 0;
                            ::std::__cxx11::ostringstream::~ostringstream(local_1c08);
                          }
LAB_0024959e:
                          std::vector<char,_std::allocator<char>_>::~vector
                                    ((vector<char,_std::allocator<char>_> *)local_1a88);
                          std::vector<char,_std::allocator<char>_>::~vector
                                    ((vector<char,_std::allocator<char>_> *)local_1a68);
                        }
                      }
                    }
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_1230);
                  poVar8 = ::std::operator<<((ostream *)local_1230,"[error]");
                  poVar8 = ::std::operator<<(poVar8,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar8 = ::std::operator<<(poVar8,"[Crate]");
                  poVar8 = ::std::operator<<(poVar8,":");
                  poVar8 = ::std::operator<<(poVar8,"ReadTokens");
                  poVar8 = ::std::operator<<(poVar8,"():");
                  poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1587);
                  ::std::operator<<(poVar8," ");
                  poVar8 = ::std::operator<<((ostream *)local_1230,
                                             "Failed to read compressedSize at `TOKENS` section.");
                  ::std::operator<<(poVar8,"\n");
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,&local_1250);
                  ::std::__cxx11::string::~string((string *)&local_1250);
                  this_local._7_1_ = 0;
                  ::std::__cxx11::ostringstream::~ostringstream(local_1230);
                }
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_d60);
              poVar8 = ::std::operator<<((ostream *)local_d60,"[error]");
              poVar8 = ::std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar8 = ::std::operator<<(poVar8,"[Crate]");
              poVar8 = ::std::operator<<(poVar8,":");
              poVar8 = ::std::operator<<(poVar8,"ReadTokens");
              poVar8 = ::std::operator<<(poVar8,"():");
              poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1573);
              ::std::operator<<(poVar8," ");
              poVar8 = ::std::operator<<((ostream *)local_d60,
                                         "Failed to read uncompressedSize at `TOKENS` section.");
              ::std::operator<<(poVar8,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_d80);
              ::std::__cxx11::string::~string((string *)&local_d80);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_d60);
            }
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_890);
          poVar8 = ::std::operator<<((ostream *)local_890,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,"[Crate]");
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReadTokens");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1561);
          ::std::operator<<(poVar8," ");
          poVar8 = ::std::operator<<((ostream *)local_890,
                                     "Failed to read # of tokens at `TOKENS` section.");
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_8b0);
          ::std::__cxx11::string::~string((string *)&local_8b0);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_890);
        }
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_510);
      poVar8 = ::std::operator<<((ostream *)local_510,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,"[Crate]");
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReadTokens");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1553);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_510,"Failed to move to `TOKENS` section.");
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_530);
      ::std::__cxx11::string::~string((string *)&local_530);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_510);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadTokens() {
  if ((_tokens_index < 0) || (_tokens_index >= int64_t(_toc.sections.size()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid index for `TOKENS` section.");
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Version must be 0.4.0 or later, but got {}.{}.{}",
      _version[0], _version[1], _version[2]));
  }

  const crate::Section &sec = _toc.sections[size_t(_tokens_index)];
  if (!_sr->seek_set(uint64_t(sec.start))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to move to `TOKENS` section.");
    return false;
  }

  if (sec.size < 4) {
     PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("`TOKENS` section data size is zero or too small."));
  }

  DCOUT("sec.start = " << sec.start);
  DCOUT("sec.size = " << sec.size);

  // # of tokens.
  uint64_t num_tokens;
  if (!_sr->read8(&num_tokens)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read # of tokens at `TOKENS` section.");
  }

  DCOUT("# of tokens = " << num_tokens);

  if (num_tokens == 0) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Empty tokens.");
  }

  if (num_tokens > _config.maxNumTokens) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many Tokens.");
  }

  // Tokens are lz4 compressed starting from version 0.4.0

  // Compressed token data.
  uint64_t uncompressedSize;
  if (!_sr->read8(&uncompressedSize)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read uncompressedSize at `TOKENS` section.");
  }

  DCOUT("uncompressedSize = " << uncompressedSize);


  // Must be larger than len(';-)') + all empty string case.
  // 3 = ';-)'
  // num_tokens = '\0' delimiter
  if ((3 + num_tokens) > uncompressedSize) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`TOKENS` section corrupted.");
  }

  // At least min size should be 16 both for compress and uncompress.
  if (uncompressedSize < 4) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "uncompressedSize too small or zero bytes.");
  }

  uint64_t compressedSize;
  if (!_sr->read8(&compressedSize)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read compressedSize at `TOKENS` section.");
  }

  DCOUT("compressedSize = " << compressedSize);

  if (compressedSize < 4) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "compressedSize is too small or zero bytes.");
  }

  if (compressedSize > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Compressed data size exceeds input file size.");
  }

  if (size_t(compressedSize) > size_t(sec.size)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Compressed data size exceeds `TOKENS` section size.");
  }

  // To combat with heap-buffer flow in lz4 cuased by corrupted lz4 compressed data,
  // We allocate same size of uncompressedSize(or larger one),
  // And further, extra 128 bytes for safety(LZ4_FAST_DEC_LOOP does 16 bytes stride memcpy)

  uint64_t bufSize = (std::max)(compressedSize, uncompressedSize);
  CHECK_MEMORY_USAGE(bufSize+128);
  CHECK_MEMORY_USAGE(uncompressedSize);


  // dst
  std::vector<char> chars(static_cast<size_t>(uncompressedSize));
  memset(chars.data(), 0, chars.size());

  std::vector<char> compressed(static_cast<size_t>(bufSize + 128));
  memset(compressed.data(), 0, compressed.size());

  if (compressedSize !=
      _sr->read(size_t(compressedSize), size_t(compressedSize),
                reinterpret_cast<uint8_t *>(compressed.data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read compressed data at `TOKENS` section.");
    return false;
  }

  if (uncompressedSize !=
      LZ4Compression::DecompressFromBuffer(compressed.data(), chars.data(),
                                           size_t(compressedSize),
                                           size_t(uncompressedSize), &_err)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to decompress data of Tokens.");
  }

  // Split null terminated string into _tokens.
  const char *ps = chars.data();
  const char *pe = chars.data() + chars.size();
  const char *pcurr = ps;
  size_t nbytes_remain = size_t(chars.size());

  auto my_strnlen = [](const char *s, const size_t max_length) -> size_t {
    if (!s) return 0;

    size_t i = 0;
    for (; i < max_length; i++) {
      if (s[i] == '\0') {
        return i;
      }
    }

    // null character not found.
    return i;
  };

  // TODO(syoyo): Check if input string has exactly `n` tokens(`n` null
  // characters)
  for (size_t i = 0; i < num_tokens; i++) {
    DCOUT("n_remain = " << nbytes_remain);

    size_t len = my_strnlen(pcurr, nbytes_remain);
    DCOUT("len = " << len);

    if ((pcurr + (len+1)) > pe) {
      _err += "Invalid token string array.\n";
      return false;
    }

    std::string str;
    if (len > 0) {
      str = std::string(pcurr, len);
    } else {
      // Empty string allowed
      str = std::string();
    }

    pcurr += len + 1;  // +1 = '\0'
    nbytes_remain = size_t(pe - pcurr);
    if (pcurr > pe) {
      _err += "Invalid token string array.\n";
      return false;
    }

    value::token tok(str);

    DCOUT("token[" << i << "] = " << tok);
    _tokens.push_back(tok);

    if (nbytes_remain == 0) {
      // reached to the string buffer end.
      break;
    }
  }

  if (_tokens.size() != num_tokens) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("The number of tokens parsed {} does not match the requested one {}", _tokens.size(), num_tokens));
  }

  return true;
}